

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.h
# Opt level: O1

void __thiscall xLearn::LinearScore::~LinearScore(LinearScore *this)

{
  pointer pcVar1;
  
  (this->super_Score)._vptr_Score = (_func_int **)&PTR__Score_00172bc8;
  pcVar1 = (this->super_Score).opt_type_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Score).opt_type_.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

~LinearScore() { }